

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_7::ReplaceMbcnt
               (IRContext *context,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  initializer_list<unsigned_int> __l_00;
  uint32_t uVar1;
  uint32_t uVar2;
  Op OVar3;
  uint32_t id;
  uint32_t uVar4;
  int iVar5;
  Analysis preserved_analyses;
  TypeManager *this;
  DefUseManager *this_00;
  Instruction *pIVar6;
  Type *pTVar7;
  TypeManager *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Operand *local_1d8;
  allocator<spvtools::opt::Operand> local_1ad;
  uint32_t local_1ac;
  iterator local_1a8;
  undefined8 local_1a0;
  SmallVector<unsigned_int,_2UL> local_198;
  Operand local_170;
  iterator local_140;
  _func_int **local_138;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_130;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_118;
  Instruction *t;
  Instruction *bitcast;
  uint local_100 [2];
  iterator local_f8;
  size_type local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  Instruction *local_d0;
  Instruction *shuffle;
  Instruction *load;
  InstructionBuilder ir_builder;
  Instruction *mask_inst;
  uint32_t mask_id;
  uint32_t shuffle_type_id;
  Type *shuffle_type;
  Vector temp_type;
  Instruction *var_type;
  Instruction *var_ptr_type;
  Instruction *var_inst;
  uint32_t var_id;
  DefUseManager *def_use_mgr;
  TypeManager *type_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_2_local;
  Instruction *inst_local;
  IRContext *context_local;
  
  this = IRContext::get_type_mgr(context);
  this_00 = IRContext::get_def_use_mgr(context);
  uVar1 = IRContext::GetBuiltinInputVarId(context,0x1144);
  if (uVar1 == 0) {
    __assert_fail("var_id != 0 && \"Could not get SubgroupLtMask variable.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x1e8,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceMbcnt(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  IRContext::AddCapability(context,GroupNonUniformBallot);
  pIVar6 = analysis::DefUseManager::GetDef(this_00,uVar1);
  uVar2 = Instruction::type_id(pIVar6);
  pIVar6 = analysis::DefUseManager::GetDef(this_00,uVar2);
  uVar2 = Instruction::GetSingleWordInOperand(pIVar6,1);
  temp_type._48_8_ = analysis::DefUseManager::GetDef(this_00,uVar2);
  OVar3 = Instruction::opcode((Instruction *)temp_type._48_8_);
  if (OVar3 != OpTypeVector) {
    __assert_fail("var_type->opcode() == spv::Op::OpTypeVector && \"Variable is suppose to be a vector of 4 ints\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x1ef,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceMbcnt(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  pTVar7 = GetUIntType(context);
  analysis::Vector::Vector((Vector *)&shuffle_type,pTVar7,2);
  this_01 = IRContext::get_type_mgr(context);
  pTVar7 = analysis::TypeManager::GetRegisteredType(this_01,(Type *)&shuffle_type);
  uVar2 = analysis::TypeManager::GetTypeInstruction(this,pTVar7);
  id = Instruction::GetSingleWordInOperand(inst,2);
  ir_builder._24_8_ = analysis::DefUseManager::GetDef(this_00,id);
  uVar4 = Instruction::type_id((Instruction *)ir_builder._24_8_);
  pTVar7 = analysis::TypeManager::GetType(this,uVar4);
  iVar5 = (*pTVar7->_vptr_Type[9])();
  if (CONCAT44(extraout_var,iVar5) == 0) {
    __assert_fail("type_mgr->GetType(mask_inst->type_id())->AsInteger() != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x1fb,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceMbcnt(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar4 = Instruction::type_id((Instruction *)ir_builder._24_8_);
  pTVar7 = analysis::TypeManager::GetType(this,uVar4);
  iVar5 = (*pTVar7->_vptr_Type[9])();
  uVar4 = analysis::Integer::width((Integer *)CONCAT44(extraout_var_00,iVar5));
  if (uVar4 != 0x40) {
    __assert_fail("type_mgr->GetType(mask_inst->type_id())->AsInteger()->width() == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x1fc,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceMbcnt(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)&load,context,inst,preserved_analyses);
  uVar4 = Instruction::result_id((Instruction *)temp_type._48_8_);
  shuffle = InstructionBuilder::AddLoad((InstructionBuilder *)&load,uVar4,uVar1,0);
  uVar1 = Instruction::result_id(shuffle);
  uVar4 = Instruction::result_id(shuffle);
  local_100[0] = 0;
  local_100[1] = 1;
  local_f8 = local_100;
  local_f0 = 2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&bitcast + 7));
  __l_00._M_len = local_f0;
  __l_00._M_array = local_f8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_e8,__l_00,(allocator_type *)((long)&bitcast + 7));
  pIVar6 = InstructionBuilder::AddVectorShuffle
                     ((InstructionBuilder *)&load,uVar2,uVar1,uVar4,&local_e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&bitcast + 7));
  local_d0 = pIVar6;
  uVar1 = Instruction::type_id((Instruction *)ir_builder._24_8_);
  uVar2 = Instruction::result_id(local_d0);
  t = InstructionBuilder::AddUnaryOp((InstructionBuilder *)&load,uVar1,OpBitcast,uVar2);
  uVar1 = Instruction::type_id((Instruction *)ir_builder._24_8_);
  uVar2 = Instruction::result_id(t);
  local_118._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )InstructionBuilder::AddBinaryOp
                             ((InstructionBuilder *)&load,uVar1,OpBitwiseAnd,uVar2,id);
  Instruction::SetOpcode(inst,OpBitCount);
  local_1ac = Instruction::result_id
                        ((Instruction *)
                         local_118._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl);
  local_1a8 = &local_1ac;
  local_1a0 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_1a8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_198,init_list);
  Operand::Operand(&local_170,SPV_OPERAND_TYPE_ID,&local_198);
  local_140 = &local_170;
  local_138 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator(&local_1ad);
  __l._M_len = (size_type)local_138;
  __l._M_array = local_140;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_130,__l,&local_1ad);
  Instruction::SetInOperands(inst,&local_130);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_130);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_1ad);
  local_1d8 = (Operand *)&local_140;
  do {
    local_1d8 = local_1d8 + -1;
    Operand::~Operand(local_1d8);
  } while (local_1d8 != &local_170);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_198);
  IRContext::UpdateDefUse(context,inst);
  analysis::Vector::~Vector((Vector *)&shuffle_type);
  return true;
}

Assistant:

bool ReplaceMbcnt(IRContext* context, Instruction* inst,
                  const std::vector<const analysis::Constant*>&) {
  analysis::TypeManager* type_mgr = context->get_type_mgr();
  analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();

  uint32_t var_id =
      context->GetBuiltinInputVarId(uint32_t(spv::BuiltIn::SubgroupLtMask));
  assert(var_id != 0 && "Could not get SubgroupLtMask variable.");
  context->AddCapability(spv::Capability::GroupNonUniformBallot);
  Instruction* var_inst = def_use_mgr->GetDef(var_id);
  Instruction* var_ptr_type = def_use_mgr->GetDef(var_inst->type_id());
  Instruction* var_type =
      def_use_mgr->GetDef(var_ptr_type->GetSingleWordInOperand(1));
  assert(var_type->opcode() == spv::Op::OpTypeVector &&
         "Variable is suppose to be a vector of 4 ints");

  // Get the type for the shuffle.
  analysis::Vector temp_type(GetUIntType(context), 2);
  const analysis::Type* shuffle_type =
      context->get_type_mgr()->GetRegisteredType(&temp_type);
  uint32_t shuffle_type_id = type_mgr->GetTypeInstruction(shuffle_type);

  uint32_t mask_id = inst->GetSingleWordInOperand(2);
  Instruction* mask_inst = def_use_mgr->GetDef(mask_id);

  // Testing with amd's shader compiler shows that a 64-bit mask is expected.
  assert(type_mgr->GetType(mask_inst->type_id())->AsInteger() != nullptr);
  assert(type_mgr->GetType(mask_inst->type_id())->AsInteger()->width() == 64);

  InstructionBuilder ir_builder(
      context, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* load = ir_builder.AddLoad(var_type->result_id(), var_id);
  Instruction* shuffle = ir_builder.AddVectorShuffle(
      shuffle_type_id, load->result_id(), load->result_id(), {0, 1});
  Instruction* bitcast = ir_builder.AddUnaryOp(
      mask_inst->type_id(), spv::Op::OpBitcast, shuffle->result_id());
  Instruction* t =
      ir_builder.AddBinaryOp(mask_inst->type_id(), spv::Op::OpBitwiseAnd,
                             bitcast->result_id(), mask_id);

  inst->SetOpcode(spv::Op::OpBitCount);
  inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {t->result_id()}}});
  context->UpdateDefUse(inst);
  return true;
}